

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int __thiscall fmt::v5::file::pipe(file *this,int *__pipedes)

{
  int extraout_EAX;
  undefined8 uVar1;
  system_error *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  int result;
  int fds [2];
  file *in_stack_ffffffffffffff98;
  basic_string_view<char> *in_stack_ffffffffffffffa0;
  file *this_00;
  file *in_stack_ffffffffffffffb0;
  file local_44;
  file local_40 [9];
  int local_1c;
  int local_18;
  int local_14;
  file *local_10;
  int error_code;
  
  local_10 = (file *)__pipedes;
  close(this,(int)__pipedes);
  error_code = (int)((ulong)this >> 0x20);
  close(local_10,(int)__pipedes);
  memset(&local_18,0,8);
  local_1c = ::pipe(&local_18);
  if (local_1c != 0) {
    uVar1 = __cxa_allocate_exception(0x18);
    __errno_location();
    basic_string_view<char>::basic_string_view
              (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    system_error::system_error<>(unaff_retaddr,error_code,(string_view)in_stack_00000008);
    __cxa_throw(uVar1,&system_error::typeinfo,system_error::~system_error);
  }
  file(local_40,local_18);
  operator=((file *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  ~file(in_stack_ffffffffffffffb0);
  this_00 = &local_44;
  file(this_00,local_14);
  operator=(this_00,in_stack_ffffffffffffff98);
  ~file(in_stack_ffffffffffffffb0);
  return extraout_EAX;
}

Assistant:

void file::pipe(file &read_end, file &write_end) {
  // Close the descriptors first to make sure that assignments don't throw
  // and there are no leaks.
  read_end.close();
  write_end.close();
  int fds[2] = {};
#ifdef _WIN32
  // Make the default pipe capacity same as on Linux 2.6.11+.
  enum { DEFAULT_CAPACITY = 65536 };
  int result = FMT_POSIX_CALL(pipe(fds, DEFAULT_CAPACITY, _O_BINARY));
#else
  // Don't retry as the pipe function doesn't return EINTR.
  // http://pubs.opengroup.org/onlinepubs/009696799/functions/pipe.html
  int result = FMT_POSIX_CALL(pipe(fds));
#endif
  if (result != 0)
    FMT_THROW(system_error(errno, "cannot create pipe"));
  // The following assignments don't throw because read_fd and write_fd
  // are closed.
  read_end = file(fds[0]);
  write_end = file(fds[1]);
}